

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  bool bVar1;
  __int_type _Var2;
  __atomic_base<int> *in_RDI;
  double dVar3;
  bool ok_to_fail;
  double in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar4;
  Approx local_38;
  Approx local_20;
  
  dVar3 = Timer::getElapsedSeconds
                    ((Timer *)CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ));
  *(double *)(in_RDI + 0x2c) = dVar3;
  _Var2 = std::__atomic_base::operator_cast_to_int(in_RDI);
  in_RDI[0x27]._M_i = _Var2 + in_RDI[0x27]._M_i;
  _Var2 = std::__atomic_base::operator_cast_to_int(in_RDI);
  in_RDI[0x28]._M_i = _Var2 + in_RDI[0x28]._M_i;
  _Var2 = std::__atomic_base::operator_cast_to_int(in_RDI);
  in_RDI[0x2a]._M_i = _Var2;
  _Var2 = std::__atomic_base::operator_cast_to_int(in_RDI);
  in_RDI[0x2b]._M_i = _Var2;
  if (in_RDI[0x2b]._M_i != 0) {
    in_RDI[0x2e]._M_i = in_RDI[0x2e]._M_i | 1;
  }
  Approx::Approx((Approx *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                 in_stack_ffffffffffffffa8);
  Approx::epsilon(&local_20,2.220446049250313e-16);
  bVar1 = doctest::operator!=((Approx *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ),in_stack_ffffffffffffffa8);
  uVar4 = false;
  if (bVar1) {
    Approx::Approx((Approx *)(ulong)CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
    Approx::epsilon(&local_38,2.220446049250313e-16);
    uVar4 = operator>((Approx *)
                      CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                      in_stack_ffffffffffffffa8);
  }
  if ((bool)uVar4 != false) {
    in_RDI[0x2e]._M_i = in_RDI[0x2e]._M_i | 0x10;
  }
  if ((*(byte *)(*(long *)(in_RDI + 10) + 0x3c) & 1) == 0) {
    if ((in_RDI[0x2e]._M_i == 0) || ((*(byte *)(*(long *)(in_RDI + 10) + 0x3b) & 1) == 0)) {
      if (0 < *(int *)(*(long *)(in_RDI + 10) + 0x40)) {
        if (in_RDI[0x2b]._M_i == *(int *)(*(long *)(in_RDI + 10) + 0x40)) {
          in_RDI[0x2e]._M_i = in_RDI[0x2e]._M_i | 0x100;
        }
        else {
          in_RDI[0x2e]._M_i = in_RDI[0x2e]._M_i | 0x80;
        }
      }
    }
    else {
      in_RDI[0x2e]._M_i = in_RDI[0x2e]._M_i | 0x200;
    }
  }
  else if (in_RDI[0x2e]._M_i == 0) {
    in_RDI[0x2e]._M_i = in_RDI[0x2e]._M_i | 0x20;
  }
  else {
    in_RDI[0x2e]._M_i = in_RDI[0x2e]._M_i | 0x40;
  }
  bVar1 = true;
  if (((in_RDI[0x2e]._M_i & 0x40U) == 0) && (bVar1 = true, (in_RDI[0x2e]._M_i & 0x200U) == 0)) {
    bVar1 = (in_RDI[0x2e]._M_i & 0x100U) != 0;
  }
  if ((in_RDI[0x2e]._M_i != 0) && (!bVar1)) {
    in_RDI[0x26]._M_i = in_RDI[0x26]._M_i + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            if(failure_flags && !ok_to_fail)
                numTestCasesFailed++;
        }